

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::BlockRequested
          (PeerManagerImpl *this,NodeId nodeid,CBlockIndex *block,iterator **pit)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  uint256 *puVar3;
  long lVar4;
  CTxMemPool *pCVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  _Base_ptr p_Var9;
  time_point tVar10;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  extraout_RDX;
  pointer *__ptr;
  _Self __tmp;
  long in_FS_OFFSET;
  bool bVar15;
  optional<long> from_peer;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar16;
  PartiallyDownloadedBlock *local_60;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  long local_38;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var14;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = block->phashBlock;
  if (puVar3 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  local_58._0_8_ = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
  local_58._8_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
  local_48 = *(_Base_ptr *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
  p_Stack_40 = *(_Base_ptr *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
  p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  p_Var13 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = &p_Var1->_M_header;
  for (; p_Var13 != (_Base_ptr)0x0; p_Var13 = (&p_Var13->_M_left)[*(long *)(p_Var13 + 1) < nodeid])
  {
    if (nodeid <= *(long *)(p_Var13 + 1)) {
      p_Var9 = p_Var13;
    }
  }
  p_Var13 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) && (p_Var13 = p_Var9, nodeid < *(long *)(p_Var9 + 1))) {
    p_Var13 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var13 == p_Var1) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                  ,0x54a,
                  "bool (anonymous namespace)::PeerManagerImpl::BlockRequested(NodeId, const CBlockIndex &, std::list<QueuedBlock>::iterator **)"
                 );
  }
  pVar16 = std::
           multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
           ::equal_range(&this->mapBlocksInFlight,(key_type *)local_58);
  _Var14 = pVar16.second._M_node;
  _Var11 = pVar16.first._M_node;
  bVar15 = _Var11._M_node == _Var14._M_node;
  if (bVar15) {
LAB_001daa91:
    from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = 1;
    from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = nodeid;
    RemoveBlockRequest(this,(uint256 *)local_58,from_peer);
    if (pit == (iterator **)0x0) {
      local_60 = (PartiallyDownloadedBlock *)0x0;
    }
    else {
      local_60 = (PartiallyDownloadedBlock *)operator_new(0xa8);
      pCVar5 = this->m_mempool;
      *(undefined8 *)local_60 = 0;
      ((_Base_ptr)local_60)->_M_parent = (_Base_ptr)0x0;
      ((_Base_ptr)local_60)->_M_left = (_Base_ptr)0x0;
      ((_Base_ptr)local_60)->_M_right = (_Base_ptr)0x0;
      *(undefined8 *)((long)local_60 + 0x20) = 0;
      ((_Base_ptr)((long)local_60 + 0x20))->_M_parent = (_Base_ptr)0x0;
      ((_Base_ptr)((long)local_60 + 0x20))->_M_left = (_Base_ptr)pCVar5;
      ((_Base_ptr)((long)local_60 + 0x80))->_M_right = (_Base_ptr)0x0;
      *(undefined8 *)((long)local_60 + 0xa0) = 0;
      ((_Base_ptr)((long)local_60 + 0x80))->_M_parent = (_Base_ptr)0x0;
      ((_Base_ptr)((long)local_60 + 0x80))->_M_left = (_Base_ptr)0x0;
      ((_Base_ptr)((long)local_60 + 0x60))->_M_right = (_Base_ptr)0x0;
      *(undefined8 *)((long)local_60 + 0x80) = 0;
      ((_Base_ptr)((long)local_60 + 0x60))->_M_parent = (_Base_ptr)0x0;
      ((_Base_ptr)((long)local_60 + 0x60))->_M_left = (_Base_ptr)0x0;
      ((_Base_ptr)((long)local_60 + 0x40))->_M_right = (_Base_ptr)0x0;
      *(undefined8 *)((long)local_60 + 0x60) = 0;
      ((_Base_ptr)((long)local_60 + 0x40))->_M_parent = (_Base_ptr)0x0;
      ((_Base_ptr)((long)local_60 + 0x40))->_M_left = (_Base_ptr)0x0;
      ((_Base_ptr)((long)local_60 + 0x20))->_M_right = (_Base_ptr)0x0;
      *(undefined8 *)((long)local_60 + 0x40) = 0;
    }
    p_Var9 = (_Base_ptr)operator_new(0x20);
    p_Var9->_M_left = (_Base_ptr)block;
    p_Var9->_M_right = (_Base_ptr)local_60;
    local_60 = (PartiallyDownloadedBlock *)0x0;
    std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var9);
    *(long *)(p_Var13 + 4) = *(long *)(p_Var13 + 4) + 1;
    if (local_60 != (PartiallyDownloadedBlock *)0x0) {
      std::default_delete<PartiallyDownloadedBlock>::operator()
                ((default_delete<PartiallyDownloadedBlock> *)&local_60,local_60);
    }
    if (*(long *)(p_Var13 + 4) == 1) {
      tVar10 = NodeClock::now();
      p_Var13[4]._M_parent = (_Base_ptr)((long)tVar10.__d.__r / 1000);
      this->m_peers_downloading_from = this->m_peers_downloading_from + 1;
    }
    _Var11._M_node = (_Base_ptr)operator_new(0x50);
    *(undefined8 *)(_Var11._M_node + 1) = local_58._0_8_;
    _Var11._M_node[1]._M_parent = (_Base_ptr)local_58._8_8_;
    _Var11._M_node[1]._M_left = local_48;
    _Var11._M_node[1]._M_right = p_Stack_40;
    *(NodeId *)(_Var11._M_node + 2) = nodeid;
    _Var11._M_node[2]._M_parent = p_Var9;
    p_Var1 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = (this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var9 = &p_Var1->_M_header;
    while (p_Var12 = p_Var13, p_Var12 != (_Base_ptr)0x0) {
      uVar7 = memcmp(_Var11._M_node + 1,p_Var12 + 1,0x20);
      p_Var9 = p_Var12;
      p_Var13 = (&p_Var12->_M_left)[~uVar7 >> 0x1f];
    }
    if (p_Var1 == (_Rb_tree_header *)p_Var9) {
      bVar6 = true;
    }
    else {
      iVar8 = memcmp(_Var11._M_node + 1,p_Var9 + 1,0x20);
      bVar6 = SUB41((uint)iVar8 >> 0x1f,0);
    }
    std::_Rb_tree_insert_and_rebalance
              (bVar6,(_Rb_tree_node_base *)_Var11._M_node,(_Rb_tree_node_base *)p_Var9,
               (_Rb_tree_node_base *)p_Var1);
    pVar16.second._M_node = extraout_RDX._M_node;
    pVar16.first._M_node = _Var11._M_node;
    psVar2 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
  }
  else {
    lVar4 = *(long *)(_Var11._M_node + 2);
    while (lVar4 != nodeid) {
      pVar16 = (pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                )std::_Rb_tree_increment((_Rb_tree_node_base *)_Var11._M_node);
      _Var11 = pVar16.first._M_node;
      bVar15 = _Var11._M_node == _Var14._M_node;
      if (bVar15) goto LAB_001daa91;
      lVar4 = *(long *)(_Var11._M_node + 2);
    }
  }
  if (pit != (iterator **)0x0) {
    *pit = (iterator *)&pVar16.first._M_node._M_node[2]._M_parent;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar15;
}

Assistant:

bool PeerManagerImpl::BlockRequested(NodeId nodeid, const CBlockIndex& block, std::list<QueuedBlock>::iterator** pit)
{
    const uint256& hash{block.GetBlockHash()};

    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    Assume(mapBlocksInFlight.count(hash) <= MAX_CMPCTBLOCKS_INFLIGHT_PER_BLOCK);

    // Short-circuit most stuff in case it is from the same node
    for (auto range = mapBlocksInFlight.equal_range(hash); range.first != range.second; range.first++) {
        if (range.first->second.first == nodeid) {
            if (pit) {
                *pit = &range.first->second.second;
            }
            return false;
        }
    }

    // Make sure it's not being fetched already from same peer.
    RemoveBlockRequest(hash, nodeid);

    std::list<QueuedBlock>::iterator it = state->vBlocksInFlight.insert(state->vBlocksInFlight.end(),
            {&block, std::unique_ptr<PartiallyDownloadedBlock>(pit ? new PartiallyDownloadedBlock(&m_mempool) : nullptr)});
    if (state->vBlocksInFlight.size() == 1) {
        // We're starting a block download (batch) from this peer.
        state->m_downloading_since = GetTime<std::chrono::microseconds>();
        m_peers_downloading_from++;
    }
    auto itInFlight = mapBlocksInFlight.insert(std::make_pair(hash, std::make_pair(nodeid, it)));
    if (pit) {
        *pit = &itInFlight->second.second;
    }
    return true;
}